

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget(QGraphicsProxyWidgetPrivate *this)

{
  QGraphicsItem *pQVar1;
  Data *pDVar2;
  QObject *pQVar3;
  long lVar4;
  QWidget *widget;
  QGraphicsProxyWidget *this_00;
  QPoint QVar5;
  undefined8 uVar6;
  QGraphicsItem *pQVar7;
  long in_FS_OFFSET;
  int iVar8;
  int iVar10;
  undefined1 auVar9 [16];
  QPoint local_70;
  QRectF local_68;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pDVar2 = (this->widget).wp.d;
  pQVar7 = pQVar1 + -1;
  if (pQVar1 == (QGraphicsItem *)0x0) {
    pQVar7 = (QGraphicsItem *)0x0;
  }
  if ((pDVar2 != (Data *)0x0) &&
     (pQVar3 = (this->widget).wp.value, pQVar3 != (QObject *)0x0 && *(int *)(pDVar2 + 4) != 0)) {
    lVar4 = *(long *)(pQVar3 + 0x20);
    iVar8 = (int)*(undefined8 *)(lVar4 + 0x14);
    local_48 = (double)iVar8;
    iVar10 = (int)((ulong)*(undefined8 *)(lVar4 + 0x14) >> 0x20);
    dStack_40 = (double)iVar10;
    local_38 = (double)(((long)*(int *)(lVar4 + 0x1c) - (long)iVar8) + 1);
    dStack_30 = (double)(((long)*(int *)(lVar4 + 0x20) - (long)iVar10) + 1);
    widget = *(QWidget **)(*(long *)(pQVar3 + 8) + 0x10);
    if ((widget != (QWidget *)0x0) && ((*(uint *)(lVar4 + 0xc) & 1) != 0)) {
      QGraphicsItem::parentWidget(pQVar7 + 1);
      this_00 = (QGraphicsProxyWidget *)
                QMetaObject::cast((QObject *)&QGraphicsProxyWidget::staticMetaObject);
      if (this_00 != (QGraphicsProxyWidget *)0x0) {
        QGraphicsProxyWidget::subWidgetRect(&local_68,this_00,widget);
        local_70 = QWidget::pos((QWidget *)(this->widget).wp.value);
        QVar5 = QWidget::mapFromGlobal(widget,&local_70);
        local_48 = (double)QVar5.xp.m_i.m_i + local_68.xp;
        dStack_40 = (double)QVar5.yp.m_i.m_i + local_68.yp;
      }
    }
    pQVar3 = (this->widget).wp.value;
    lVar4 = *(long *)(pQVar3 + 0x20);
    iVar8 = (int)*(undefined8 *)(lVar4 + 0x1c) - (int)*(undefined8 *)(lVar4 + 0x14);
    iVar10 = (int)((ulong)*(undefined8 *)(lVar4 + 0x1c) >> 0x20) -
             (int)((ulong)*(undefined8 *)(lVar4 + 0x14) >> 0x20);
    auVar9._0_4_ = -(uint)(-1 < iVar8 + 1);
    auVar9._4_4_ = -(uint)(-1 < iVar8 + 1);
    auVar9._8_4_ = -(uint)(-1 < iVar10 + 1);
    auVar9._12_4_ = -(uint)(-1 < iVar10 + 1);
    iVar8 = movmskpd((int)lVar4,auVar9);
    if (iVar8 != 3) {
      uVar6 = (**(code **)(*(long *)pQVar3 + 0x70))();
      local_38 = (double)(int)uVar6;
      dStack_30 = (double)(int)((ulong)uVar6 >> 0x20);
    }
    *(ushort *)&this->field_0x244 = (ushort)*(undefined4 *)&this->field_0x244 & 0xfff0 | 10;
    (*pQVar7->_vptr_QGraphicsItem[0xc])(pQVar7,&local_48);
    this->field_0x244 = this->field_0x244 & 0xf0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget()
{
    Q_Q(QGraphicsProxyWidget);
    if (!widget)
        return;

    QRectF widgetGeometry = widget->geometry();
    QWidget *parentWidget = widget->parentWidget();
    if (widget->isWindow()) {
        QGraphicsProxyWidget *proxyParent = nullptr;
        if (parentWidget && (proxyParent = qobject_cast<QGraphicsProxyWidget *>(q->parentWidget()))) {
            // Nested window proxy (e.g., combobox popup), map widget to the
            // parent widget's global coordinates, and map that to the parent
            // proxy's child coordinates.
            widgetGeometry.moveTo(proxyParent->subWidgetRect(parentWidget).topLeft()
                                  + parentWidget->mapFromGlobal(widget->pos()));
        }
    }

    // Adjust to size hint if the widget has never been resized.
    if (!widget->size().isValid())
        widgetGeometry.setSize(widget->sizeHint());

    // Assign new geometry.
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    q->setGeometry(widgetGeometry);
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}